

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O3

bool xmrig::NvmlLib::dlopen(void)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = "libnvidia-ml.so";
  if (m_loader != (char *)0x0) {
    pcVar2 = m_loader;
  }
  iVar1 = uv_dlopen(pcVar2,nvmlLib);
  return iVar1 == 0;
}

Assistant:

bool xmrig::NvmlLib::dlopen()
{
    if (!m_loader.isNull()) {
        return uv_dlopen(m_loader, &nvmlLib) == 0;
    }

#   ifdef _WIN32
    if (uv_dlopen("nvml.dll", &nvmlLib) == 0) {
        return true;
    }

    char path[MAX_PATH] = { 0 };
    ExpandEnvironmentStringsA("%PROGRAMFILES%\\NVIDIA Corporation\\NVSMI\\nvml.dll", path, sizeof(path));

    return uv_dlopen(path, &nvmlLib) == 0;
#   else
    return uv_dlopen("libnvidia-ml.so", &nvmlLib) == 0;
#   endif
}